

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O0

void __thiscall
btCapsuleShapeZ::btCapsuleShapeZ(btCapsuleShapeZ *this,btScalar radius,btScalar height)

{
  btCapsuleShape *in_RDI;
  float in_XMM1_Da;
  float local_14;
  float local_10;
  btScalar local_c [3];
  
  local_10 = in_XMM1_Da;
  btCapsuleShape::btCapsuleShape(in_RDI);
  (in_RDI->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
  _vptr_btCollisionShape = (_func_int **)&PTR__btCapsuleShapeZ_002e4070;
  *(undefined4 *)&(in_RDI->super_btConvexInternalShape).field_0x44 = 2;
  local_14 = local_10 * 0.5;
  btVector3::setValue(&(in_RDI->super_btConvexInternalShape).m_implicitShapeDimensions,local_c,
                      local_c,&local_14);
  return;
}

Assistant:

btCapsuleShapeZ::btCapsuleShapeZ(btScalar radius,btScalar height)
{
	m_upAxis = 2;
	m_implicitShapeDimensions.setValue(radius,radius,0.5f*height);
}